

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init_gnss_settings(fsnav_gnss *gnss)

{
  ulong local_18;
  size_t i;
  fsnav_gnss *gnss_local;
  
  fsnav_locatecfggroup("",gnss->cfg,gnss->cfglength,&gnss->cfg_settings,&gnss->settings_length);
  (gnss->settings).sinEl_mask = 0.0;
  (gnss->settings).code_sigma = 20.0;
  (gnss->settings).phase_sigma = 0.01;
  (gnss->settings).doppler_sigma = 0.5;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    (gnss->settings).ant_pos[local_18] = 0.0;
  }
  (gnss->settings).ant_pos_tol = -1.0;
  (gnss->settings).leap_sec_def = 0.0;
  return '\x01';
}

Assistant:

char fsnav_init_gnss_settings(fsnav_gnss* gnss)
{
	size_t i;

	fsnav_locatecfggroup("", gnss->cfg, gnss->cfglength, &(gnss->cfg_settings), &(gnss->settings_length));

	gnss->settings.sinEl_mask     = 0;
	gnss->settings.code_sigma     = 20;
	gnss->settings.phase_sigma    = 0.01;
	gnss->settings.doppler_sigma  = 0.5;
	for (i = 0; i < 3; i++)
		gnss->settings.ant_pos[i] = 0;
	gnss->settings.ant_pos_tol    = -1;
	gnss->settings.leap_sec_def   = 0;

	return 1;
}